

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O3

bool basist::transcode_uastc_to_bc1(uastc_block *src_blk,void *pDst,bool high_quality)

{
  bool bVar1;
  unpacked_uastc_block unpacked_src_blk;
  color32 block_pixels [4] [4];
  unpacked_uastc_block local_100;
  color32 local_68 [18];
  
  bVar1 = unpack_uastc(src_blk,&local_100,false,true);
  if (bVar1) {
    if (local_100.m_mode == 8) {
      encode_bc1_solid_block
                (pDst,(uint)local_100.m_solid_color.field_0.field_0.r,
                 (uint)local_100.m_solid_color.field_0.field_0.g,
                 (uint)local_100.m_solid_color.field_0.field_0.b);
    }
    else if ((high_quality) || (local_100.m_bc1_hint0 != true)) {
      unpack_uastc(local_100.m_mode,local_100.m_common_pattern,&local_100.m_solid_color,
                   &local_100.m_astc,local_68,false);
      if (local_100.m_bc1_hint1 == true) {
        transcode_uastc_to_bc1_hint1(&local_100,(color32 (*) [4])local_68,pDst,high_quality);
      }
      else {
        encode_bc1(pDst,(uint8_t *)local_68,(uint)high_quality);
      }
    }
    else {
      transcode_uastc_to_bc1_hint0(&local_100,pDst);
    }
  }
  return bVar1;
}

Assistant:

bool transcode_uastc_to_bc1(const uastc_block& src_blk, void* pDst, bool high_quality)
	{
		unpacked_uastc_block unpacked_src_blk;
		if (!unpack_uastc(src_blk, unpacked_src_blk, false))
			return false;

		const uint32_t mode = unpacked_src_blk.m_mode;

		if (mode == UASTC_MODE_INDEX_SOLID_COLOR)
		{
			encode_bc1_solid_block(pDst, unpacked_src_blk.m_solid_color.r, unpacked_src_blk.m_solid_color.g, unpacked_src_blk.m_solid_color.b);
			return true;
		}

		if ((!high_quality) && (unpacked_src_blk.m_bc1_hint0))
			transcode_uastc_to_bc1_hint0(unpacked_src_blk, pDst);
		else
		{
			color32 block_pixels[4][4];
			const bool unpack_srgb = false;
			if (!unpack_uastc(unpacked_src_blk, &block_pixels[0][0], unpack_srgb))
				return false;

			if (unpacked_src_blk.m_bc1_hint1)
				transcode_uastc_to_bc1_hint1(unpacked_src_blk, block_pixels, pDst, high_quality);
			else
				encode_bc1(pDst, &block_pixels[0][0].r, high_quality ? cEncodeBC1HighQuality : 0);
		}

		return true;
	}